

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

void stbir__resample_vertical_downsample(stbir__info *stbir_info,int n)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int ring_buffer_num_entries;
  int iVar4;
  int begin_index;
  int first_scanline;
  int iVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  float *pfVar9;
  float *ring_buffer_00;
  int iVar10;
  int iVar11;
  float *pfVar12;
  int local_90;
  int c;
  int in_pixel_index_4;
  int in_pixel_index_3;
  int in_pixel_index_2;
  int in_pixel_index_1;
  int in_pixel_index;
  float *ring_buffer_entry;
  float coefficient;
  int coefficient_group;
  int coefficient_index;
  int n1;
  int n0;
  int ring_buffer_length;
  int ring_buffer_first_scanline;
  int ring_buffer_begin_index;
  float *ring_buffer;
  int contributor;
  int coefficient_width;
  float *horizontal_buffer;
  int ring_buffer_entries;
  int channels;
  float *vertical_coefficients;
  stbir__contributors *vertical_contributors;
  int output_w;
  int k;
  int x;
  int n_local;
  stbir__info *stbir_info_local;
  
  iVar2 = stbir_info->output_w;
  pfVar8 = stbir_info->vertical_coefficients;
  iVar3 = stbir_info->channels;
  ring_buffer_num_entries = stbir_info->ring_buffer_num_entries;
  pfVar9 = stbir_info->horizontal_buffer;
  iVar4 = stbir_info->vertical_coefficient_width;
  iVar10 = n + stbir_info->vertical_filter_pixel_margin;
  ring_buffer_00 = stbir_info->ring_buffer;
  begin_index = stbir_info->ring_buffer_begin_index;
  first_scanline = stbir_info->ring_buffer_first_scanline;
  iVar5 = stbir_info->ring_buffer_length_bytes;
  iVar6 = stbir_info->vertical_contributors[iVar10].n0;
  iVar7 = stbir_info->vertical_contributors[iVar10].n1;
  iVar11 = stbir__use_height_upsampling(stbir_info);
  vertical_contributors._4_4_ = iVar6;
  if (iVar11 != 0) {
    __assert_fail("!stbir__use_height_upsampling(stbir_info)",
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                  ,0x7d5,"void stbir__resample_vertical_downsample(stbir__info *, int)");
  }
  for (; vertical_contributors._4_4_ <= iVar7;
      vertical_contributors._4_4_ = vertical_contributors._4_4_ + 1) {
    fVar1 = pfVar8[iVar4 * iVar10 + (vertical_contributors._4_4_ - iVar6)];
    pfVar12 = stbir__get_ring_buffer_scanline
                        (vertical_contributors._4_4_,ring_buffer_00,begin_index,first_scanline,
                         ring_buffer_num_entries,(int)((ulong)(long)iVar5 >> 2));
    switch(iVar3) {
    case 1:
      for (output_w = 0; output_w < iVar2; output_w = output_w + 1) {
        pfVar12[output_w] = pfVar9[output_w] * fVar1 + pfVar12[output_w];
      }
      break;
    case 2:
      for (output_w = 0; output_w < iVar2; output_w = output_w + 1) {
        iVar11 = output_w * 2;
        pfVar12[iVar11] = pfVar9[iVar11] * fVar1 + pfVar12[iVar11];
        pfVar12[iVar11 + 1] = pfVar9[iVar11 + 1] * fVar1 + pfVar12[iVar11 + 1];
      }
      break;
    case 3:
      for (output_w = 0; output_w < iVar2; output_w = output_w + 1) {
        iVar11 = output_w * 3;
        pfVar12[iVar11] = pfVar9[iVar11] * fVar1 + pfVar12[iVar11];
        pfVar12[iVar11 + 1] = pfVar9[iVar11 + 1] * fVar1 + pfVar12[iVar11 + 1];
        pfVar12[iVar11 + 2] = pfVar9[iVar11 + 2] * fVar1 + pfVar12[iVar11 + 2];
      }
      break;
    case 4:
      for (output_w = 0; output_w < iVar2; output_w = output_w + 1) {
        iVar11 = output_w * 4;
        pfVar12[iVar11] = pfVar9[iVar11] * fVar1 + pfVar12[iVar11];
        pfVar12[iVar11 + 1] = pfVar9[iVar11 + 1] * fVar1 + pfVar12[iVar11 + 1];
        pfVar12[iVar11 + 2] = pfVar9[iVar11 + 2] * fVar1 + pfVar12[iVar11 + 2];
        pfVar12[iVar11 + 3] = pfVar9[iVar11 + 3] * fVar1 + pfVar12[iVar11 + 3];
      }
      break;
    default:
      for (output_w = 0; output_w < iVar2; output_w = output_w + 1) {
        for (local_90 = 0; local_90 < iVar3; local_90 = local_90 + 1) {
          iVar11 = output_w * iVar3 + local_90;
          pfVar12[iVar11] = pfVar9[output_w * iVar3 + local_90] * fVar1 + pfVar12[iVar11];
        }
      }
    }
  }
  return;
}

Assistant:

static void stbir__resample_vertical_downsample(stbir__info* stbir_info, int n)
{
    int x, k;
    int output_w = stbir_info->output_w;
    stbir__contributors* vertical_contributors = stbir_info->vertical_contributors;
    float* vertical_coefficients = stbir_info->vertical_coefficients;
    int channels = stbir_info->channels;
    int ring_buffer_entries = stbir_info->ring_buffer_num_entries;
    float* horizontal_buffer = stbir_info->horizontal_buffer;
    int coefficient_width = stbir_info->vertical_coefficient_width;
    int contributor = n + stbir_info->vertical_filter_pixel_margin;

    float* ring_buffer = stbir_info->ring_buffer;
    int ring_buffer_begin_index = stbir_info->ring_buffer_begin_index;
    int ring_buffer_first_scanline = stbir_info->ring_buffer_first_scanline;
    int ring_buffer_length = stbir_info->ring_buffer_length_bytes/sizeof(float);
    int n0,n1;

    n0 = vertical_contributors[contributor].n0;
    n1 = vertical_contributors[contributor].n1;

    STBIR_ASSERT(!stbir__use_height_upsampling(stbir_info));

    for (k = n0; k <= n1; k++)
    {
        int coefficient_index = k - n0;
        int coefficient_group = coefficient_width * contributor;
        float coefficient = vertical_coefficients[coefficient_group + coefficient_index];

        float* ring_buffer_entry = stbir__get_ring_buffer_scanline(k, ring_buffer, ring_buffer_begin_index, ring_buffer_first_scanline, ring_buffer_entries, ring_buffer_length);

        switch (channels) {
            case 1:
                for (x = 0; x < output_w; x++)
                {
                    int in_pixel_index = x * 1;
                    ring_buffer_entry[in_pixel_index + 0] += horizontal_buffer[in_pixel_index + 0] * coefficient;
                }
                break;
            case 2:
                for (x = 0; x < output_w; x++)
                {
                    int in_pixel_index = x * 2;
                    ring_buffer_entry[in_pixel_index + 0] += horizontal_buffer[in_pixel_index + 0] * coefficient;
                    ring_buffer_entry[in_pixel_index + 1] += horizontal_buffer[in_pixel_index + 1] * coefficient;
                }
                break;
            case 3:
                for (x = 0; x < output_w; x++)
                {
                    int in_pixel_index = x * 3;
                    ring_buffer_entry[in_pixel_index + 0] += horizontal_buffer[in_pixel_index + 0] * coefficient;
                    ring_buffer_entry[in_pixel_index + 1] += horizontal_buffer[in_pixel_index + 1] * coefficient;
                    ring_buffer_entry[in_pixel_index + 2] += horizontal_buffer[in_pixel_index + 2] * coefficient;
                }
                break;
            case 4:
                for (x = 0; x < output_w; x++)
                {
                    int in_pixel_index = x * 4;
                    ring_buffer_entry[in_pixel_index + 0] += horizontal_buffer[in_pixel_index + 0] * coefficient;
                    ring_buffer_entry[in_pixel_index + 1] += horizontal_buffer[in_pixel_index + 1] * coefficient;
                    ring_buffer_entry[in_pixel_index + 2] += horizontal_buffer[in_pixel_index + 2] * coefficient;
                    ring_buffer_entry[in_pixel_index + 3] += horizontal_buffer[in_pixel_index + 3] * coefficient;
                }
                break;
            default:
                for (x = 0; x < output_w; x++)
                {
                    int in_pixel_index = x * channels;

                    int c;
                    for (c = 0; c < channels; c++)
                        ring_buffer_entry[in_pixel_index + c] += horizontal_buffer[in_pixel_index + c] * coefficient;
                }
                break;
        }
    }
}